

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void relu(pBox *pbox,mydataFmt *pbias)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  float local_3c;
  int local_38;
  int local_34;
  int col;
  int channel;
  long dis;
  mydataFmt *pb;
  mydataFmt *op;
  mydataFmt *pbias_local;
  pBox *pbox_local;
  
  if (pbox->pdata == (mydataFmt *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"the  Relu feature is NULL!!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (pbias == (mydataFmt *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"the  Relu bias is NULL!!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    pb = pbox->pdata;
    iVar1 = pbox->width;
    iVar2 = pbox->height;
    dis = (long)pbias;
    for (local_34 = 0; local_34 < pbox->channel; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < iVar1 * iVar2; local_38 = local_38 + 1) {
        *pb = *pb + *(float *)dis;
        if (*pb <= 0.0) {
          local_3c = *pb * 0.0;
        }
        else {
          local_3c = *pb;
        }
        *pb = local_3c;
        pb = pb + 1;
      }
      dis = dis + 4;
    }
  }
  return;
}

Assistant:

void relu(struct pBox *pbox, mydataFmt *pbias) {
    if (pbox->pdata == NULL) {
        cout << "the  Relu feature is NULL!!" << endl;
        return;
    }
    if (pbias == NULL) {
        cout << "the  Relu bias is NULL!!" << endl;
        return;
    }
    mydataFmt *op = pbox->pdata;
    mydataFmt *pb = pbias;

    long dis = pbox->width * pbox->height;
    for (int channel = 0; channel < pbox->channel; channel++) {
        for (int col = 0; col < dis; col++) {
            *op = *op + *pb;
            *op = (*op > 0) ? (*op) : ((*op) * 0);
            op++;
        }
        pb++;
    }
}